

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

bool __thiscall
QAbstractSocket::setSocketDescriptor
          (QAbstractSocket *this,qintptr socketDescriptor,SocketState socketState,OpenMode openMode)

{
  byte bVar1;
  bool bVar2;
  quint16 qVar3;
  QAbstractSocketPrivate *pQVar4;
  QAbstractSocketEngine *pQVar5;
  ulong uVar6;
  undefined4 in_ECX;
  SocketState in_EDX;
  qintptr in_RSI;
  QFlags_conflict *in_RDI;
  long in_FS_OFFSET;
  bool result;
  QAbstractSocketPrivate *d;
  int outboundStreamCount;
  int inboundStreamCount;
  undefined4 in_stack_ffffffffffffff18;
  SocketState in_stack_ffffffffffffff1c;
  QAbstractSocketPrivate *in_stack_ffffffffffffff20;
  QAbstractSocketPrivate *in_stack_ffffffffffffff28;
  QObject *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  bool local_69;
  int local_54;
  int local_50 [3];
  undefined4 local_44;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_ECX;
  pQVar4 = d_func((QAbstractSocket *)0x252a10);
  QAbstractSocketPrivate::resetSocketLayer(in_stack_ffffffffffffff20);
  QIODevicePrivate::setReadChannelCount((int)pQVar4);
  QIODevicePrivate::setWriteChannelCount((int)pQVar4);
  pQVar5 = QAbstractSocketEngine::createSocketEngine
                     (CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff48);
  pQVar4->socketEngine = pQVar5;
  if (pQVar4->socketEngine == (QAbstractSocketEngine *)0x0) {
    tr((char *)in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c
      );
    QAbstractSocketPrivate::setError
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(QString *)0x252aa2);
    QString::~QString((QString *)0x252aaf);
    local_69 = false;
  }
  else {
    bVar1 = (**(code **)(*(long *)pQVar4->socketEngine + 0x68))(pQVar4->socketEngine,in_RSI,in_EDX);
    if ((bVar1 & 1) == 0) {
      QAbstractSocketEngine::error((QAbstractSocketEngine *)0x252afc);
      QAbstractSocketEngine::errorString((QAbstractSocketEngine *)in_stack_ffffffffffffff28);
      QAbstractSocketPrivate::setError
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(QString *)0x252b2f);
      QString::~QString((QString *)0x252b3c);
      local_69 = false;
    }
    else {
      pQVar4->socketError = UnknownSocketError;
      QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x252b63);
      bVar2 = QThreadData::hasEventDispatcher((QThreadData *)0x252b6b);
      if (bVar2) {
        QAbstractSocketEngine::setReceiver
                  ((QAbstractSocketEngine *)in_stack_ffffffffffffff20,
                   (QAbstractSocketEngineReceiver *)
                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      }
      local_44 = local_c;
      QIODevice::open(in_RDI);
      if (in_EDX == ConnectedState) {
        uVar6 = QIODevice::isReadable();
        if ((uVar6 & 1) != 0) {
          local_50[2] = QAbstractSocketEngine::inboundStreamCount((QAbstractSocketEngine *)0x252c03)
          ;
          local_50[1] = 1;
          in_stack_ffffffffffffff28 = pQVar4;
          qMax<int>(local_50 + 1,local_50 + 2);
          QIODevicePrivate::setReadChannelCount((int)in_stack_ffffffffffffff28);
          if (local_50[2] == 0) {
            *(undefined4 *)&pQVar4->field_0xa8 = 0;
          }
        }
        uVar6 = QIODevice::isWritable();
        if ((uVar6 & 1) != 0) {
          local_50[0] = QAbstractSocketEngine::outboundStreamCount
                                  ((QAbstractSocketEngine *)0x252c7c);
          local_54 = 1;
          in_stack_ffffffffffffff20 = pQVar4;
          qMax<int>(&local_54,local_50);
          QIODevicePrivate::setWriteChannelCount((int)in_stack_ffffffffffffff20);
          if (local_50[0] == 0) {
            *(undefined4 *)&pQVar4->field_0xac = 0;
          }
        }
      }
      else {
        *(undefined4 *)&pQVar4->field_0xac = 0;
        *(undefined4 *)&pQVar4->field_0xa8 = 0;
      }
      if (pQVar4->state != in_EDX) {
        pQVar4->state = in_EDX;
        stateChanged((QAbstractSocket *)0x252d29,in_stack_ffffffffffffff1c);
      }
      pQVar4->pendingClose = false;
      (**(code **)(*(long *)pQVar4->socketEngine + 0x140))(pQVar4->socketEngine,1);
      qVar3 = QAbstractSocketEngine::localPort((QAbstractSocketEngine *)0x252d60);
      pQVar4->localPort = qVar3;
      qVar3 = QAbstractSocketEngine::peerPort((QAbstractSocketEngine *)0x252d80);
      pQVar4->peerPort = qVar3;
      QAbstractSocketEngine::localAddress((QAbstractSocketEngine *)in_stack_ffffffffffffff28);
      QHostAddress::operator=
                ((QHostAddress *)in_stack_ffffffffffffff20,
                 (QHostAddress *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QHostAddress::~QHostAddress((QHostAddress *)0x252dce);
      QAbstractSocketEngine::peerAddress((QAbstractSocketEngine *)in_stack_ffffffffffffff28);
      QHostAddress::operator=
                ((QHostAddress *)in_stack_ffffffffffffff20,
                 (QHostAddress *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QHostAddress::~QHostAddress((QHostAddress *)0x252e0d);
      pQVar4->cachedSocketDescriptor = in_RSI;
      local_69 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_69;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractSocket::setSocketDescriptor(qintptr socketDescriptor, SocketState socketState,
                                          OpenMode openMode)
{
    Q_D(QAbstractSocket);

    d->resetSocketLayer();
    d->setReadChannelCount(0);
    d->setWriteChannelCount(0);
    d->socketEngine = QAbstractSocketEngine::createSocketEngine(socketDescriptor, this);
    if (!d->socketEngine) {
        d->setError(UnsupportedSocketOperationError, tr("Operation on socket is not supported"));
        return false;
    }
    bool result = d->socketEngine->initialize(socketDescriptor, socketState);
    if (!result) {
        d->setError(d->socketEngine->error(), d->socketEngine->errorString());
        return false;
    }

    // Sync up with error string, which open() shall clear.
    d->socketError = UnknownSocketError;
    if (d->threadData.loadRelaxed()->hasEventDispatcher())
        d->socketEngine->setReceiver(d);

    QIODevice::open(openMode);

    if (socketState == ConnectedState) {
        if (isReadable()) {
            const int inboundStreamCount = d->socketEngine->inboundStreamCount();
            d->setReadChannelCount(qMax(1, inboundStreamCount));
            if (inboundStreamCount == 0)
                d->readChannelCount = 0;
        }
        if (isWritable()) {
            const int outboundStreamCount = d->socketEngine->outboundStreamCount();
            d->setWriteChannelCount(qMax(1, outboundStreamCount));
            if (outboundStreamCount == 0)
                d->writeChannelCount = 0;
        }
    } else {
        d->readChannelCount = d->writeChannelCount = 0;
    }

    if (d->state != socketState) {
        d->state = socketState;
        emit stateChanged(d->state);
    }

    d->pendingClose = false;
    d->socketEngine->setReadNotificationEnabled(true);
    d->localPort = d->socketEngine->localPort();
    d->peerPort = d->socketEngine->peerPort();
    d->localAddress = d->socketEngine->localAddress();
    d->peerAddress = d->socketEngine->peerAddress();
    d->cachedSocketDescriptor = socketDescriptor;

    return true;
}